

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapElements
          (Reflection *this,Message *message,FieldDescriptor *field,int index1,int index2)

{
  void *pvVar1;
  bool bVar2;
  uint32 uVar3;
  RepeatedPtrFieldBase *pRVar4;
  Rep *pRVar5;
  MapFieldBase *this_00;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"Swap",
               "Field is singular; the method requires a repeated field.");
  }
  if (field[0x42] != (FieldDescriptor)0x1) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_38 = FieldDescriptor::TypeOnceInit;
      local_40 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_38,&local_40);
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
    case 8:
      uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<int>::SwapElements
                ((RepeatedField<int> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),index1,
                 index2);
      break;
    case 2:
      uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<long>::SwapElements
                ((RepeatedField<long> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),index1,
                 index2);
      break;
    case 3:
      uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_int>::SwapElements
                ((RepeatedField<unsigned_int> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),index1,
                 index2);
      break;
    case 4:
      uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<unsigned_long>::SwapElements
                ((RepeatedField<unsigned_long> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),index1,
                 index2);
      break;
    case 5:
      uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<double>::SwapElements
                ((RepeatedField<double> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),index1,
                 index2);
      break;
    case 6:
      uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<float>::SwapElements
                ((RepeatedField<float> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),index1,
                 index2);
      break;
    case 7:
      uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      RepeatedField<bool>::SwapElements
                ((RepeatedField<bool> *)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),index1,
                 index2);
      break;
    case 9:
    case 10:
      bVar2 = anon_unknown_0::IsMapFieldInApi(field);
      uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
      this_00 = (MapFieldBase *)
                ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
      if (bVar2) {
        pRVar4 = internal::MapFieldBase::MutableRepeatedField(this_00);
        pRVar5 = pRVar4->rep_;
      }
      else {
        pRVar5 = (Rep *)this_00->repeated_field_;
      }
      pvVar1 = pRVar5->elements[index1];
      pRVar5->elements[index1] = pRVar5->elements[index2];
      pRVar5->elements[index2] = pvVar1;
    }
    return;
  }
  internal::ExtensionSet::SwapElements
            ((ExtensionSet *)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),index1,index2);
  return;
}

Assistant:

void Reflection::SwapElements(Message* message, const FieldDescriptor* field,
                              int index1, int index2) const {
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                 \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:              \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field) \
        ->SwapElements(index1, index2);                   \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->SwapElements(index1, index2);
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->SwapElements(index1, index2);
        }
        break;
    }
  }
}